

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O3

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiMesh>::~TempArray(TempArray<std::vector,_aiMesh> *this)

{
  pointer ppaVar1;
  aiMesh *this_00;
  pointer ppaVar2;
  mywrap *__range3;
  
  ppaVar2 = (this->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar1 = (this->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppaVar2 != ppaVar1) {
    do {
      this_00 = *ppaVar2;
      if (this_00 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_00);
      }
      operator_delete(this_00,0x520);
      ppaVar2 = ppaVar2 + 1;
    } while (ppaVar2 != ppaVar1);
    ppaVar2 = (this->arr).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2,(long)(this->arr).
                                  super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar2);
    return;
  }
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }